

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ict.cpp
# Opt level: O1

ExprNode * __thiscall Canonicalizer::visit(Canonicalizer *this,ESEQ *node)

{
  _func_int **pp_Var1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ESEQ *this_00;
  SEQ *this_01;
  undefined4 extraout_var_02;
  StmNode *pSVar3;
  long *plVar4;
  StmNode *right;
  long *plVar5;
  ExprNode *pEVar6;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  
  iVar2 = (*(node->super_ExprNode).super_StmNode.super_ICTNode._vptr_ICTNode[5])(node);
  pp_Var1 = (node->super_ExprNode).super_StmNode.super_ICTNode._vptr_ICTNode;
  if (CONCAT44(extraout_var,iVar2) == 0) {
    iVar2 = (*pp_Var1[4])(node);
    pSVar3 = (StmNode *)
             (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar2) + 0x18))
                       ((long *)CONCAT44(extraout_var_03,iVar2),this);
    ESEQ::setS(node,pSVar3);
    iVar2 = (*(node->super_ExprNode).super_StmNode.super_ICTNode._vptr_ICTNode[5])(node);
    pEVar6 = (ExprNode *)
             (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar2) + 0x18))
                       ((long *)CONCAT44(extraout_var_04,iVar2),this);
    ESEQ::setE(node,pEVar6);
  }
  else {
    iVar2 = (*pp_Var1[5])();
    iVar2 = StmNode::getTypeStm((StmNode *)CONCAT44(extraout_var_00,iVar2));
    if (iVar2 == 7) {
      this->changed = true;
      iVar2 = (*(node->super_ExprNode).super_StmNode.super_ICTNode._vptr_ICTNode[5])(node);
      plVar5 = (long *)CONCAT44(extraout_var_01,iVar2);
      this_00 = (ESEQ *)operator_new(0x20);
      this_01 = (SEQ *)operator_new(0x20);
      iVar2 = (*(node->super_ExprNode).super_StmNode.super_ICTNode._vptr_ICTNode[4])(node);
      pSVar3 = (StmNode *)
               (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x18))
                         ((long *)CONCAT44(extraout_var_02,iVar2),this);
      plVar4 = (long *)(**(code **)(*plVar5 + 0x20))(plVar5);
      right = (StmNode *)(**(code **)(*plVar4 + 0x18))(plVar4,this);
      SEQ::SEQ(this_01,pSVar3,right);
      plVar5 = (long *)(**(code **)(*plVar5 + 0x28))(plVar5);
      pEVar6 = (ExprNode *)(**(code **)(*plVar5 + 0x18))(plVar5,this);
      ESEQ::ESEQ(this_00,(StmNode *)this_01,pEVar6);
      node = this_00;
    }
  }
  return &node->super_ExprNode;
}

Assistant:

ExprNode *Canonicalizer::visit(ESEQ *node) {

    if (node->getE()) {
        if (node->getE()->getTypeStm() == V_ESEQ) {
            changed = true;
            ExprNode *eseq = node->getE();
            return new ESEQ(new SEQ(node->getS()->accept(this), eseq->getS()->accept(this)),
                            eseq->getE()->accept(this));
        }
    } else {
        node->setS(node->getS()->accept(this));
        node->setE(node->getE()->accept(this));
    }
    return node;
}